

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_compareEquivalentNonStandardWhichCannotBeResolvedUnits_Test::TestBody
          (Units_compareEquivalentNonStandardWhichCannotBeResolvedUnits_Test *this)

{
  string *psVar1;
  char cVar2;
  AssertionResult gtest_ar_;
  UnitsPtr u2;
  UnitsPtr u1;
  AssertionResult local_88;
  long local_78 [2];
  long *local_68;
  long *local_60;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  long local_50 [2];
  AssertHelper local_40 [8];
  string *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  string *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Units::create();
  psVar1 = local_28;
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"a","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"millisecond","");
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  libcellml::Units::addUnit(local_28,-1.0,(string *)&local_88);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_38;
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"b","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"millisecond","");
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  libcellml::Units::addUnit(local_38,-1.0,(string *)&local_88);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  cVar2 = libcellml::Units::equivalent((shared_ptr *)&local_28,(shared_ptr *)&local_38);
  local_60 = (long *)(CONCAT71(local_60._1_7_,cVar2) ^ 1);
  local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar2 != '\0') {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_88,(char *)&local_60,"libcellml::Units::equivalent(u1, u2)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x676,(char *)local_88._0_8_);
    testing::internal::AssertHelper::operator=(local_40,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(local_40);
    if ((long *)local_88._0_8_ != local_78) {
      operator_delete((void *)local_88._0_8_,local_78[0] + 1);
    }
    if (local_68 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_68 != (long *)0x0)) {
        (**(code **)(*local_68 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Units, compareEquivalentNonStandardWhichCannotBeResolvedUnits)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("a");
    u1->addUnit("millisecond", -1);

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("b");
    u2->addUnit("millisecond", -1);

    EXPECT_FALSE(libcellml::Units::equivalent(u1, u2));
}